

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool Is11SectorTrack(Track *track)

{
  Sector *pSVar1;
  bool bVar2;
  int iVar3;
  Sector *s;
  Sector *this;
  bool bVar4;
  
  iVar3 = Track::size(track);
  if (iVar3 == 0xb) {
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_start; bVar4 = this != pSVar1, bVar4; this = this + 1) {
      if ((this->datarate != _250K) || (this->encoding != MFM)) {
LAB_0016f0af:
        if (bVar4) goto LAB_0016f0d9;
        break;
      }
      iVar3 = Sector::size(this);
      if (iVar3 != 0x200) goto LAB_0016f0af;
      bVar2 = Sector::has_good_data(this);
      if (!bVar2) goto LAB_0016f0af;
    }
    bVar4 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [32])"detected 11-sector tight track\n");
    }
  }
  else {
LAB_0016f0d9:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Is11SectorTrack(const Track& track)
{
    if (track.size() != 11)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.size() != 512 || !s.has_good_data())
        {
            return false;
        }
    }

    if (opt.debug) util::cout << "detected 11-sector tight track\n";
    return true;
}